

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::WriteUndoDataForBlock
          (BlockManager *this,CBlockUndo *blockundo,BlockValidationState *state,CBlockIndex *block)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Notifications *notifications;
  bool bVar4;
  optional<node::BlockfileCursor> *poVar5;
  FlatFilePos FVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  FlatFilePos _pos;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = block->nHeight;
  iVar2 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value;
  bVar4 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock19.super_unique_lock
             ,&this->cs_LastBlockFile,"cs_LastBlockFile",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
             ,0x3df,false);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  poVar5 = inline_assertion_check<true,std::optional<node::BlockfileCursor>&>
                     ((this->m_blockfile_cursors)._M_elems + (byte)(iVar2 <= iVar1 & bVar4),
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                      ,0x3df,"WriteUndoDataForBlock",
                      "WITH_LOCK(cs_LastBlockFile, return m_blockfile_cursors[type])");
  FVar6 = CBlockIndex::GetUndoPos(block);
  bVar4 = true;
  if (FVar6.nFile == -1) {
    _pos.nFile = -1;
    _pos.nPos = 0;
    iVar1 = block->nFile;
    sVar7 = GetSerializeSize<CBlockUndo>(blockundo);
    bVar4 = FindUndoPos(this,state,iVar1,&_pos,(int)sVar7 + 0x28);
    if (bVar4) {
      CBlockIndex::GetBlockHash((uint256 *)&criticalblock19,block->pprev);
      bVar4 = UndoWriteToDisk(this,blockundo,&_pos,(uint256 *)&criticalblock19);
      if (bVar4) {
        iVar1 = (poVar5->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
                super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
        if ((_pos.nFile < iVar1) &&
           (block->nHeight ==
            (this->m_blockfile_info).
            super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start[_pos.nFile].nHeightLast)) {
          bVar4 = FlushUndoFile(this,_pos.nFile,true);
          if (!bVar4) {
            bVar4 = ::LogAcceptCategory(BLOCKSTORAGE,Warning);
            if (bVar4) {
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
              ;
              source_file._M_len = 0x65;
              logging_function._M_str = "WriteUndoDataForBlock";
              logging_function._M_len = 0x15;
              LogPrintFormatInternal<int>
                        (logging_function,source_file,0x3f7,BLOCKSTORAGE,Warning,
                         (ConstevalFormatString<1U>)0xc9e129,&_pos.nFile);
            }
          }
        }
        else if ((_pos.nFile == iVar1) &&
                ((poVar5->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
                 super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.undo_height
                 < block->nHeight)) {
          (poVar5->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.undo_height =
               block->nHeight;
        }
        bVar4 = true;
        block->nUndoPos = _pos.nPos;
        *(byte *)&block->nStatus = (byte)block->nStatus | 0x10;
        criticalblock19.super_unique_lock._M_device = (mutex_type *)block;
        std::
        _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
        ::_M_insert_unique<CBlockIndex*>
                  ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    *)&this->m_dirty_blockindex,(CBlockIndex **)&criticalblock19);
      }
      else {
        notifications = (this->m_opts).notifications;
        _((bilingual_str *)&criticalblock19,(ConstevalStringLiteral)0xc9e10e);
        bVar4 = FatalError(notifications,state,(bilingual_str *)&criticalblock19);
        bilingual_str::~bilingual_str((bilingual_str *)&criticalblock19);
      }
    }
    else {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_00._M_len = 0x65;
      logging_function_00._M_str = "WriteUndoDataForBlock";
      logging_function_00._M_len = 0x15;
      LogPrintFormatInternal<char[22]>
                (logging_function_00,source_file_00,0x3e5,ALL,Error,
                 (ConstevalFormatString<1U>)0xc9e0f6,(char (*) [22])"WriteUndoDataForBlock");
      bVar4 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteUndoDataForBlock(const CBlockUndo& blockundo, BlockValidationState& state, CBlockIndex& block)
{
    AssertLockHeld(::cs_main);
    const BlockfileType type = BlockfileTypeForHeight(block.nHeight);
    auto& cursor = *Assert(WITH_LOCK(cs_LastBlockFile, return m_blockfile_cursors[type]));

    // Write undo information to disk
    if (block.GetUndoPos().IsNull()) {
        FlatFilePos _pos;
        if (!FindUndoPos(state, block.nFile, _pos, ::GetSerializeSize(blockundo) + 40)) {
            LogError("%s: FindUndoPos failed\n", __func__);
            return false;
        }
        if (!UndoWriteToDisk(blockundo, _pos, block.pprev->GetBlockHash())) {
            return FatalError(m_opts.notifications, state, _("Failed to write undo data."));
        }
        // rev files are written in block height order, whereas blk files are written as blocks come in (often out of order)
        // we want to flush the rev (undo) file once we've written the last block, which is indicated by the last height
        // in the block file info as below; note that this does not catch the case where the undo writes are keeping up
        // with the block writes (usually when a synced up node is getting newly mined blocks) -- this case is caught in
        // the FindNextBlockPos function
        if (_pos.nFile < cursor.file_num && static_cast<uint32_t>(block.nHeight) == m_blockfile_info[_pos.nFile].nHeightLast) {
            // Do not propagate the return code, a failed flush here should not
            // be an indication for a failed write. If it were propagated here,
            // the caller would assume the undo data not to be written, when in
            // fact it is. Note though, that a failed flush might leave the data
            // file untrimmed.
            if (!FlushUndoFile(_pos.nFile, true)) {
                LogPrintLevel(BCLog::BLOCKSTORAGE, BCLog::Level::Warning, "Failed to flush undo file %05i\n", _pos.nFile);
            }
        } else if (_pos.nFile == cursor.file_num && block.nHeight > cursor.undo_height) {
            cursor.undo_height = block.nHeight;
        }
        // update nUndoPos in block index
        block.nUndoPos = _pos.nPos;
        block.nStatus |= BLOCK_HAVE_UNDO;
        m_dirty_blockindex.insert(&block);
    }

    return true;
}